

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdjpeg.c
# Opt level: O2

void start_progress_monitor(j_common_ptr cinfo,cd_progress_ptr progress)

{
  if (cinfo->err->trace_level != 0) {
    return;
  }
  (progress->pub).progress_monitor = progress_monitor;
  progress->completed_extra_passes = 0;
  progress->total_extra_passes = 0;
  progress->max_scans = 0;
  progress->report = 0;
  progress->percent_done = -1;
  cinfo->progress = &progress->pub;
  return;
}

Assistant:

GLOBAL(void)
start_progress_monitor(j_common_ptr cinfo, cd_progress_ptr progress)
{
  /* Enable progress display, unless trace output is on */
  if (cinfo->err->trace_level == 0) {
    progress->pub.progress_monitor = progress_monitor;
    progress->completed_extra_passes = 0;
    progress->total_extra_passes = 0;
    progress->max_scans = 0;
    progress->report = FALSE;
    progress->percent_done = -1;
    cinfo->progress = &progress->pub;
  }
}